

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

void __thiscall
capnp::compiler::NodeTranslator::compileValue
          (NodeTranslator *this,Reader source,Reader type,Schema typeScope,Builder target,
          bool isBootstrap)

{
  ushort uVar1;
  bool bVar2;
  ulong uVar3;
  undefined1 *puVar4;
  SegmentBuilder *unaff_R13;
  ulong uVar5;
  StringPtr name;
  ReaderFor<DynamicEnum> RVar6;
  Type type_00;
  ValueTranslator valueTranslator;
  ResolverGlue glue;
  SegmentBuilder *local_120;
  anon_union_16_9_7f184501_for_Orphan<capnp::DynamicValue>_2 aStack_118;
  OrphanBuilder OStack_108;
  undefined1 local_e8 [32];
  OrphanBuilder OStack_c8;
  short local_a0;
  anon_union_8_2_eba6ea51_for_Type_5 local_98;
  StructSchema local_90;
  ValueTranslator local_88;
  Resolver local_68;
  NodeTranslator *local_60;
  undefined1 local_58;
  anon_union_8_2_eba6ea51_for_Type_5 local_50;
  anon_union_8_2_eba6ea51_for_Type_5 local_48;
  SegmentBuilder *local_40;
  undefined4 local_38;
  
  local_88.resolver = &local_68;
  local_68._vptr_Resolver = (_func_int **)&PTR_Reader__00218b08;
  local_88.errorReporter = this->errorReporter;
  local_88.orphanage.arena = (this->orphanage).arena;
  local_88.orphanage.capTable = (this->orphanage).capTable;
  puVar4 = local_e8;
  local_60 = this;
  local_58 = isBootstrap;
  (*this->resolver->_vptr_Resolver[10])(puVar4,this->resolver,typeScope.raw);
  if (local_e8[0] == true) {
    local_98 = (anon_union_8_2_eba6ea51_for_Type_5)local_e8._16_8_;
    puVar4 = (undefined1 *)((ulong)local_e8._8_8_ >> 0x10 & 0xffff);
    uVar5 = local_e8._8_8_ & 0xffffffffff000000;
    unaff_R13 = (SegmentBuilder *)local_e8._8_8_;
  }
  else {
    uVar5 = 0;
  }
  if (local_e8[0] != false) {
    local_90.super_Schema.raw = (Schema)((long)schemas::s_d07378ede1f9cc60 + 0x48);
    StructSchema::getUnionFields((FieldSubset *)local_e8,&local_90);
    uVar3 = 0xe;
    if ((char)puVar4 == '\0') {
      uVar3 = (ulong)unaff_R13 & 0xffff;
    }
    uVar1 = *(ushort *)((long)OStack_c8.location + uVar3 * 2);
    local_a0 = (short)unaff_R13;
    capnp::_::ListReader::getStructElement
              ((StructReader *)&aStack_118.enumValue,(ListReader *)(local_e8 + 8),(uint)uVar1);
    local_120 = (SegmentBuilder *)CONCAT44(local_120._4_4_,(uint)uVar1);
    if (OStack_108.capTable._4_2_ == 0) {
      local_38 = 0x7fffffff;
      local_48.schema = (RawBrandedSchema *)0x0;
      local_40 = (SegmentBuilder *)0x0;
      local_50.schema = (RawBrandedSchema *)0x0;
    }
    else {
      local_48 = aStack_118.listSchema.elementType.field_4;
      local_40 = OStack_108.segment;
      local_50.scopeId = aStack_118.uintValue;
      local_38 = OStack_108.location._0_4_;
    }
    name.content = (ArrayPtr<const_char>)
                   capnp::_::PointerReader::getBlob<capnp::Text>
                             ((PointerReader *)&local_50,(void *)0x0,0);
    uVar5 = uVar5 | (ulong)unaff_R13 & 0xffff | (ulong)(((uint)puVar4 & 0xff) << 0x10);
    type_00.field_4.schema = local_98.schema;
    type_00.baseType = (short)uVar5;
    type_00.listDepth = (char)(uVar5 >> 0x10);
    type_00.isImplicitParam = (bool)(char)(uVar5 >> 0x18);
    type_00.field_3 = (anon_union_2_2_d12d5221_for_Type_3)(short)(uVar5 >> 0x20);
    type_00._6_2_ = (short)(uVar5 >> 0x30);
    ValueTranslator::compileValue
              ((Maybe<capnp::Orphan<capnp::DynamicValue>_> *)local_e8,&local_88,source,type_00);
    bVar2 = local_e8[0];
    if (local_e8[0] == true) {
      aStack_118.listSchema.elementType.field_4 =
           (anon_union_8_2_eba6ea51_for_Type_5)local_e8._24_8_;
      OStack_108.tag.content = OStack_c8.tag.content;
      local_120 = (SegmentBuilder *)local_e8._8_8_;
      aStack_118.intValue = local_e8._16_8_;
      OStack_108.segment = OStack_c8.segment;
      OStack_108.capTable = OStack_c8.capTable;
      OStack_108.location = OStack_c8.location;
      OStack_c8.segment = (SegmentBuilder *)0x0;
      OStack_c8.location = (word *)0x0;
    }
    if ((local_e8[0] != false) && (OStack_c8.segment != (SegmentBuilder *)0x0)) {
      capnp::_::OrphanBuilder::euthanize(&OStack_c8);
    }
    if (bVar2 == true) {
      if ((char)puVar4 == '\0' && local_a0 == 0xf) {
        Orphan<capnp::DynamicValue>::getReader
                  ((Reader *)local_e8,(Orphan<capnp::DynamicValue> *)&local_120);
        RVar6 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                          ((Reader *)local_e8);
        *(undefined2 *)target._builder.data = 0xf;
        *(uint16_t *)((long)target._builder.data + 2) = RVar6.value;
        DynamicValue::Reader::~Reader((Reader *)local_e8);
      }
      else {
        OStack_c8.segment = (SegmentBuilder *)target._builder._32_8_;
        local_e8._24_8_ = target._builder.data;
        OStack_c8.tag.content = (uint64_t)target._builder.pointers;
        local_e8._8_8_ = target._builder.segment;
        local_e8._16_8_ = target._builder.capTable;
        local_e8._0_8_ = (long)schemas::s_ce23dcd2d7b00c9b + 0x48;
        DynamicStruct::Builder::adopt
                  ((Builder *)local_e8,name,(Orphan<capnp::DynamicValue> *)&local_120);
      }
    }
    if ((bVar2 == true) && (OStack_108.segment != (SegmentBuilder *)0x0)) {
      capnp::_::OrphanBuilder::euthanize(&OStack_108);
    }
  }
  return;
}

Assistant:

void NodeTranslator::compileValue(Expression::Reader source, schema::Type::Reader type,
                                  Schema typeScope, schema::Value::Builder target,
                                  bool isBootstrap) {
  class ResolverGlue: public ValueTranslator::Resolver {
  public:
    inline ResolverGlue(NodeTranslator& translator, bool isBootstrap)
        : translator(translator), isBootstrap(isBootstrap) {}

    kj::Maybe<DynamicValue::Reader> resolveConstant(Expression::Reader name) override {
      return translator.readConstant(name, isBootstrap);
    }

    kj::Maybe<kj::Array<const byte>> readEmbed(LocatedText::Reader filename) override {
      return translator.readEmbed(filename);
    }

  private:
    NodeTranslator& translator;
    bool isBootstrap;
  };

  ResolverGlue glue(*this, isBootstrap);
  ValueTranslator valueTranslator(glue, errorReporter, orphanage);

  KJ_IF_SOME(typeSchema, resolver.resolveBootstrapType(type, typeScope)) {
    kj::StringPtr fieldName = Schema::from<schema::Type>()
        .getUnionFields()[static_cast<uint>(typeSchema.which())].getProto().getName();

    KJ_IF_SOME(value, valueTranslator.compileValue(source, typeSchema)) {
      if (typeSchema.isEnum()) {
        target.setEnum(value.getReader().as<DynamicEnum>().getRaw());
      } else {
        toDynamic(target).adopt(fieldName, kj::mv(value));
      }
    }
  }
}